

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ForwardTypedefDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForwardTypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  ForwardTypedefDeclarationSyntax *this_00;
  
  this_00 = (ForwardTypedefDeclarationSyntax *)allocate(this,0x80,8);
  TVar5 = args_1->kind;
  uVar6 = args_1->field_0x2;
  NVar7.raw = (args_1->numFlags).raw;
  uVar8 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar9 = args_2->kind;
  uVar10 = args_2->field_0x2;
  NVar11.raw = (args_2->numFlags).raw;
  uVar12 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar13 = args_3->kind;
  uVar14 = args_3->field_0x2;
  NVar15.raw = (args_3->numFlags).raw;
  uVar16 = args_3->rawLen;
  pIVar3 = args_3->info;
  TVar17 = args_4->kind;
  uVar18 = args_4->field_0x2;
  NVar19.raw = (args_4->numFlags).raw;
  uVar20 = args_4->rawLen;
  pIVar4 = args_4->info;
  slang::syntax::MemberSyntax::MemberSyntax((MemberSyntax *)this_00,ForwardTypedefDeclaration,args);
  (this_00->typedefKeyword).kind = TVar5;
  (this_00->typedefKeyword).field_0x2 = uVar6;
  (this_00->typedefKeyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (this_00->typedefKeyword).rawLen = uVar8;
  (this_00->typedefKeyword).info = pIVar1;
  (this_00->keyword).kind = TVar9;
  (this_00->keyword).field_0x2 = uVar10;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (this_00->keyword).rawLen = uVar12;
  (this_00->keyword).info = pIVar2;
  (this_00->name).kind = TVar13;
  (this_00->name).field_0x2 = uVar14;
  (this_00->name).numFlags = (NumericTokenFlags)NVar15.raw;
  (this_00->name).rawLen = uVar16;
  (this_00->name).info = pIVar3;
  (this_00->semi).kind = TVar17;
  (this_00->semi).field_0x2 = uVar18;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar19.raw;
  (this_00->semi).rawLen = uVar20;
  (this_00->semi).info = pIVar4;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }